

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<Header>::copyAppend(QGenericArrayOps<Header> *this,Header *b,Header *e)

{
  Header *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Header *in_RDI;
  Header *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<Header>::begin((QArrayDataPointer<Header> *)0x1d7f27);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      Header::Header(this_00,in_RDI);
      local_10 = local_10 + 0x38;
      *(long *)((long)&(in_RDI->name).data.
                       super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x10) =
           *(long *)((long)&(in_RDI->name).data.
                            super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                            super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x10
                    ) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }